

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O0

int archive_write_set_format_xar(archive *_a)

{
  int iVar1;
  xar_conflict *xar_00;
  file_conflict *pfVar2;
  int magic_test;
  xar_conflict *xar;
  archive_write *a;
  archive *_a_local;
  
  iVar1 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_set_format_xar");
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = -0x1e;
  }
  else {
    if (_a[2].archive_format_name != (char *)0x0) {
      (*(code *)_a[2].archive_format_name)(_a);
    }
    xar_00 = (xar_conflict *)calloc(1,0x101c8);
    if (xar_00 == (xar_conflict *)0x0) {
      archive_set_error(_a,0xc,"Can\'t allocate xar data");
      _a_local._4_4_ = -0x1e;
    }
    else {
      xar_00->temp_fd = -1;
      file_init_register(xar_00);
      file_init_hardlinks(xar_00);
      (xar_00->tstr).s = (char *)0x0;
      (xar_00->tstr).length = 0;
      (xar_00->tstr).buffer_length = 0;
      (xar_00->vstr).s = (char *)0x0;
      (xar_00->vstr).length = 0;
      (xar_00->vstr).buffer_length = 0;
      pfVar2 = file_create_virtual_dir((archive_write *)_a,xar_00,"");
      xar_00->root = pfVar2;
      if (xar_00->root == (file_conflict *)0x0) {
        free(xar_00);
        archive_set_error(_a,0xc,"Can\'t allocate xar data");
        _a_local._4_4_ = -0x1e;
      }
      else {
        xar_00->root->parent = xar_00->root;
        file_register(xar_00,xar_00->root);
        xar_00->cur_dirent = xar_00->root;
        (xar_00->cur_dirstr).s = (char *)0x0;
        (xar_00->cur_dirstr).length = 0;
        (xar_00->cur_dirstr).buffer_length = 0;
        archive_string_ensure(&xar_00->cur_dirstr,1);
        *(xar_00->cur_dirstr).s = '\0';
        xar_00->opt_toc_sumalg = CKSUM_SHA1;
        xar_00->opt_sumalg = CKSUM_SHA1;
        xar_00->opt_compression = GZIP;
        xar_00->opt_compression_level = 6;
        xar_00->opt_threads = 1;
        _a[1].read_data_offset = (int64_t)xar_00;
        _a[1].read_data_output_offset = (int64_t)"xar";
        *(code **)&_a[1].read_data_is_posix_read = xar_options;
        *(code **)(_a + 2) = xar_write_header;
        _a[2].vtable = (archive_vtable *)xar_write_data;
        _a[1].read_data_requested = (size_t)xar_finish_entry;
        *(code **)&_a[2].archive_format = xar_close;
        _a[2].archive_format_name = (char *)xar_free;
        _a->archive_format = 0xa0000;
        _a->archive_format_name = "xar";
        _a_local._4_4_ = 0;
      }
    }
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_write_set_format_xar(struct archive *_a)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct xar *xar;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_set_format_xar");

	/* If another format was already registered, unregister it. */
	if (a->format_free != NULL)
		(a->format_free)(a);

	xar = calloc(1, sizeof(*xar));
	if (xar == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate xar data");
		return (ARCHIVE_FATAL);
	}
	xar->temp_fd = -1;
	file_init_register(xar);
	file_init_hardlinks(xar);
	archive_string_init(&(xar->tstr));
	archive_string_init(&(xar->vstr));

	/*
	 * Create the root directory.
	 */
	xar->root = file_create_virtual_dir(a, xar, "");
	if (xar->root == NULL) {
		free(xar);
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate xar data");
		return (ARCHIVE_FATAL);
	}
	xar->root->parent = xar->root;
	file_register(xar, xar->root);
	xar->cur_dirent = xar->root;
	archive_string_init(&(xar->cur_dirstr));
	archive_string_ensure(&(xar->cur_dirstr), 1);
	xar->cur_dirstr.s[0] = 0;

	/*
	 * Initialize option.
	 */
	/* Set default checksum type. */
	xar->opt_toc_sumalg = CKSUM_SHA1;
	xar->opt_sumalg = CKSUM_SHA1;
	/* Set default compression type, level, and number of threads. */
	xar->opt_compression = GZIP;
	xar->opt_compression_level = 6;
	xar->opt_threads = 1;

	a->format_data = xar;

	a->format_name = "xar";
	a->format_options = xar_options;
	a->format_write_header = xar_write_header;
	a->format_write_data = xar_write_data;
	a->format_finish_entry = xar_finish_entry;
	a->format_close = xar_close;
	a->format_free = xar_free;
	a->archive.archive_format = ARCHIVE_FORMAT_XAR;
	a->archive.archive_format_name = "xar";

	return (ARCHIVE_OK);
}